

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::setWindowFlags(QMdiSubWindowPrivate *this,WindowFlags windowFlags)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<Qt::WindowType> mask;
  int iVar3;
  int iVar4;
  QSize *otherSize;
  QAction *pQVar5;
  QSizeGrip *pQVar6;
  Int in_ESI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QAction *stayOnTopAction;
  QMdiSubWindow *q;
  QSize currentSize;
  WindowFlags windowType;
  undefined4 in_stack_ffffffffffffff48;
  WindowType in_stack_ffffffffffffff4c;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff50;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff58;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff5c;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff80;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff8c;
  QMdiSubWindowPrivate *pQVar9;
  QFlagsStorage<Qt::WindowType> flags;
  QFlagsStorageHelper<Qt::WindowType,_4> local_48;
  QFlagsStorageHelper<Qt::WindowType,_4> local_44;
  Int local_40;
  QFlagsStorageHelper<Qt::WindowType,_4> local_3c;
  Int local_38;
  QFlagsStorageHelper<Qt::WindowType,_4> local_34;
  QFlagsStorageHelper<Qt::WindowType,_4> local_30;
  QFlagsStorageHelper<Qt::WindowType,_4> local_2c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_28;
  undefined4 local_24;
  QFlagsStorageHelper<Qt::WindowType,_4> local_20;
  QFlagsStorageHelper<Qt::WindowType,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_18;
  Int local_14;
  Int local_10;
  QFlagsStorage<Qt::WindowType> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  local_c.i = in_ESI;
  otherSize = (QSize *)q_func(in_RDI);
  flags.i = (Int)((ulong)pQVar9 >> 0x20);
  if (*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 == 0) {
    local_10 = local_c.i;
    QWidgetPrivate::setWindowFlags
              ((QWidgetPrivate *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68))),
               (WindowFlags)flags.i);
  }
  else {
    local_14 = 0xaaaaaaaa;
    local_18.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_14 = (Int)local_18.super_QFlagsStorage<Qt::WindowType>.i;
    bVar1 = ::operator==((QFlags<Qt::WindowType>)in_stack_ffffffffffffff5c.i,
                         (WindowType)in_stack_ffffffffffffff50);
    uVar8 = true;
    if (!bVar1) {
      local_1c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
      ;
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      uVar8 = IVar2 != 0;
    }
    if ((bool)uVar8 != false) {
      in_stack_ffffffffffffff8c.i =
           (Int)Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              (enum_type)in_stack_ffffffffffffff50);
      QFlags<Qt::WindowType>::operator|=
                ((QFlags<Qt::WindowType> *)&local_c,
                 (QFlags<Qt::WindowType>)in_stack_ffffffffffffff8c.i);
    }
    local_24 = 0x200f800;
    local_20.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,
                    (QFlags<Qt::WindowType>)in_stack_ffffffffffffff58.i);
    bVar1 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_20);
    if (bVar1) {
      local_2c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                         (enum_type)in_stack_ffffffffffffff50);
      local_28.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator|
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
      ;
      in_stack_ffffffffffffff88.i =
           (Int)QFlags<Qt::WindowType>::operator|
                          ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff4c);
      QFlags<Qt::WindowType>::operator|=
                ((QFlags<Qt::WindowType> *)&local_c,
                 (QFlags<Qt::WindowType>)in_stack_ffffffffffffff88.i);
    }
    else {
      local_30.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
      ;
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
      in_stack_ffffffffffffff6e = false;
      if (IVar2 != 0) {
        local_34.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QFlags<Qt::WindowType>::operator&
                       ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff4c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
        in_stack_ffffffffffffff6e = IVar2 != 0;
      }
      if ((bool)in_stack_ffffffffffffff6e == false) {
        local_3c.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QFlags<Qt::WindowType>::operator&
                       ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff4c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
        if (IVar2 != 0) {
          QFlags<Qt::WindowType>::QFlags
                    ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          local_c.i = local_40;
        }
      }
      else {
        local_38 = (Int)Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                      (enum_type)in_stack_ffffffffffffff50);
        local_c.i = local_38;
      }
    }
    mask.i = (Int)QFlags<Qt::WindowType>::operator~
                            ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50);
    QFlags<Qt::WindowType>::operator&=
              ((QFlags<Qt::WindowType> *)&local_c,(QFlags<Qt::WindowType>)mask.i);
    QFlags<Qt::WindowType>::operator&=((QFlags<Qt::WindowType> *)&local_c,0x7fffffff);
    QFlags<Qt::WindowType>::operator|=((QFlags<Qt::WindowType> *)&local_c,SubWindow);
    pQVar5 = ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x6325d6);
    if (pQVar5 != (QAction *)0x0) {
      local_44.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
      ;
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
      if (IVar2 == 0) {
        QAction::setChecked(SUB81(pQVar5,0));
      }
      else {
        QAction::setChecked(SUB81(pQVar5,0));
      }
    }
    local_48.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
    uVar7 = false;
    if (IVar2 != 0) {
      uVar7 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x632665);
    }
    if (((bool)uVar7 != false) &&
       (pQVar6 = ::QPointer::operator_cast_to_QSizeGrip_((QPointer<QSizeGrip> *)0x632684),
       pQVar6 != (QSizeGrip *)0x0)) {
      (**(code **)(*(long *)&pQVar6->super_QWidget + 0x20))();
    }
    QWidgetPrivate::setWindowFlags
              ((QWidgetPrivate *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(uVar7,in_stack_ffffffffffffff68))),
               (WindowFlags)flags.i);
    updateGeometryConstraints
              ((QMdiSubWindowPrivate *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(uVar7,in_stack_ffffffffffffff68))));
    updateActions(in_stack_ffffffffffffff50);
    QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = QWidget::isVisible((QWidget *)0x6326ee);
    if (bVar1) {
      iVar3 = QSize::width((QSize *)0x632701);
      iVar4 = QSize::width((QSize *)0x632716);
      if (iVar4 <= iVar3) {
        in_stack_ffffffffffffff58.i = QSize::height((QSize *)0x63272a);
        iVar4 = QSize::height((QSize *)0x63273f);
        if (iVar4 <= (int)in_stack_ffffffffffffff58.i) goto LAB_0063277d;
      }
      QSize::expandedTo((QSize *)CONCAT44(iVar3,in_stack_ffffffffffffff58.i),otherSize);
      QWidget::resize((QWidget *)CONCAT44(in_stack_ffffffffffffff8c.i,in_stack_ffffffffffffff88.i),
                      (QSize *)CONCAT44(mask.i,in_stack_ffffffffffffff80));
    }
  }
LAB_0063277d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setWindowFlags(Qt::WindowFlags windowFlags)
{
    Q_Q(QMdiSubWindow);

    if (!parent) {
        QWidgetPrivate::setWindowFlags(windowFlags);
        return;
    }

    Qt::WindowFlags windowType = windowFlags & Qt::WindowType_Mask;
    if (windowType == Qt::Dialog || windowFlags & Qt::MSWindowsFixedSizeDialogHint)
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint;

    // Set standard flags if none of the customize flags are set
    if (!(windowFlags & CustomizeWindowFlags))
        windowFlags |= Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowMinMaxButtonsHint | Qt::WindowCloseButtonHint;
    else if (windowFlags & Qt::FramelessWindowHint && windowFlags & Qt::WindowStaysOnTopHint)
        windowFlags = Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint;
    else if (windowFlags & Qt::FramelessWindowHint)
        windowFlags = Qt::FramelessWindowHint;

    windowFlags &= ~windowType;
    windowFlags &= ~Qt::WindowFullscreenButtonHint;
    windowFlags |= Qt::SubWindow;

#ifndef QT_NO_ACTION
    if (QAction *stayOnTopAction = actions[QMdiSubWindowPrivate::StayOnTopAction]) {
        if (windowFlags & Qt::WindowStaysOnTopHint)
            stayOnTopAction->setChecked(true);
        else
            stayOnTopAction->setChecked(false);
    }
#endif

#if QT_CONFIG(sizegrip)
    if ((windowFlags & Qt::FramelessWindowHint) && sizeGrip)
        delete sizeGrip;
#endif

    QWidgetPrivate::setWindowFlags(windowFlags);
    updateGeometryConstraints();
    updateActions();
    QSize currentSize = q->size();
    if (q->isVisible() && (currentSize.width() < internalMinimumSize.width()
            || currentSize.height() < internalMinimumSize.height())) {
        q->resize(currentSize.expandedTo(internalMinimumSize));
    }
}